

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sig_block.c
# Opt level: O1

void sig_blocknone(void)

{
  sigset_t ss;
  sigset_t sStack_88;
  
  sigemptyset(&sStack_88);
  sigprocmask(2,&sStack_88,(sigset_t *)0x0);
  return;
}

Assistant:

void sig_blocknone(void)
{
#ifdef HASSIGPROCMASK
  sigset_t ss;
  sigemptyset(&ss);
  sigprocmask(SIG_SETMASK,&ss,(sigset_t *) 0);
#else
  sigsetmask(0);
#endif
}